

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

cgltf_size
cgltf_calc_index_bound
          (cgltf_buffer_view *buffer_view,cgltf_size offset,cgltf_component_type component_type,
          cgltf_size count)

{
  void *pvVar1;
  long lVar2;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  cgltf_size v_2;
  size_t i_2;
  cgltf_size v_1;
  size_t i_1;
  cgltf_size v;
  size_t i;
  cgltf_size bound;
  char *data;
  cgltf_size count_local;
  cgltf_component_type component_type_local;
  cgltf_size offset_local;
  cgltf_buffer_view *buffer_view_local;
  
  pvVar1 = buffer_view->buffer->data;
  lVar2 = buffer_view->offset + offset;
  i = 0;
  if (component_type == cgltf_component_type_r_8u) {
    for (v = 0; v < count; v = v + 1) {
      local_78 = (ulong)*(byte *)((long)pvVar1 + v + lVar2);
      if (local_78 < i) {
        local_78 = i;
      }
      i = local_78;
    }
  }
  else if (component_type == cgltf_component_type_r_16u) {
    for (v_1 = 0; v_1 < count; v_1 = v_1 + 1) {
      local_80 = (ulong)*(ushort *)((long)pvVar1 + v_1 * 2 + lVar2);
      if (local_80 < i) {
        local_80 = i;
      }
      i = local_80;
    }
  }
  else if (component_type == cgltf_component_type_r_32u) {
    for (v_2 = 0; v_2 < count; v_2 = v_2 + 1) {
      local_88 = (ulong)*(uint *)((long)pvVar1 + v_2 * 4 + lVar2);
      if (local_88 < i) {
        local_88 = i;
      }
      i = local_88;
    }
  }
  return i;
}

Assistant:

static cgltf_size cgltf_calc_index_bound(cgltf_buffer_view* buffer_view, cgltf_size offset, cgltf_component_type component_type, cgltf_size count)
{
    char* data = (char*)buffer_view->buffer->data + offset + buffer_view->offset;
    cgltf_size bound = 0;

    switch (component_type)
    {
        case cgltf_component_type_r_8u:
            for (size_t i = 0; i < count; ++i)
            {
                cgltf_size v = ((unsigned char*)data)[i];
                bound = bound > v ? bound : v;
            }
            break;

        case cgltf_component_type_r_16u:
            for (size_t i = 0; i < count; ++i)
            {
                cgltf_size v = ((unsigned short*)data)[i];
                bound = bound > v ? bound : v;
            }
            break;

        case cgltf_component_type_r_32u:
            for (size_t i = 0; i < count; ++i)
            {
                cgltf_size v = ((unsigned int*)data)[i];
                bound = bound > v ? bound : v;
            }
            break;

        default:
            ;
    }

    return bound;
}